

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O1

int Ssw_RarCheckTrivial(Aig_Man_t *pAig,int fVerbose)

{
  uint uVar1;
  Abc_Cex_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = pAig->nTruePos;
  if (0 < (long)iVar5) {
    uVar1 = pAig->vCos->nSize;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    do {
      if (uVar3 == uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((pAig->nConstrs != 0) && ((long)(iVar5 - pAig->nConstrs) <= (long)uVar4)) {
        return 0;
      }
      if ((*(byte *)((long)pAig->vCos->pArray[uVar4] + 0x18) & 8) != 0) {
        if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
          free(pAig->pSeqModel);
          pAig->pSeqModel = (Abc_Cex_t *)0x0;
        }
        iVar5 = pAig->nRegs;
        pAVar2 = Abc_CexAlloc(iVar5,pAig->nTruePis,1);
        pAig->pSeqModel = pAVar2;
        pAVar2->iPo = (int)uVar4;
        if (fVerbose != 0) {
          Abc_Print(iVar5,"Output %d is trivally SAT in frame 0. \n",uVar4 & 0xffffffff);
          return 1;
        }
        return 1;
      }
      uVar4 = uVar4 + 1;
    } while ((long)iVar5 != uVar4);
  }
  return 0;
}

Assistant:

int Ssw_RarCheckTrivial( Aig_Man_t * pAig, int fVerbose )
{
    Aig_Obj_t * pObj;
    int i;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( pAig->nConstrs && i >= Saig_ManPoNum(pAig) - pAig->nConstrs )
            return 0;
        if ( pObj->fPhase )
        {
            ABC_FREE( pAig->pSeqModel );
            pAig->pSeqModel = Abc_CexAlloc( Aig_ManRegNum(pAig), Saig_ManPiNum(pAig), 1 );
            pAig->pSeqModel->iPo = i;
            if ( fVerbose )
                Abc_Print( 1, "Output %d is trivally SAT in frame 0. \n", i );
            return 1;
        }
    }
    return 0;
}